

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall nodesTest_methodTesting_Test::TestBody(nodesTest_methodTesting_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  undefined1 local_60 [8];
  nodes node1;
  nodes node2;
  AssertionResult gtest_ar_1;
  AssertHelper local_18;
  
  nodes::nodes((nodes *)local_60);
  node2.f_cost_ = (double)((ulong)node2.f_cost_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&node1.f_cost_,"node1.x_","0",(int *)local_60,(int *)&node2.f_cost_);
  if (node1.f_cost_._0_1_ == '\0') {
    testing::Message::Message((Message *)&node2.f_cost_);
    if (node2._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)node2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&node2.f_cost_);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (node2.f_cost_ != 0.0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (node2.f_cost_ != 0.0)) {
        (**(code **)(*(long *)node2.f_cost_ + 8))();
      }
      node2.f_cost_ = 0.0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&node2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&node2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    nodes::nodes((nodes *)&node1.f_cost_,1,1,0.0,0.0);
    local_18.data_ = (AssertHelperData *)((ulong)local_18.data_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<double,int>
              ((internal *)&node2.f_cost_,"node2.f_cost_","0",&node2.g_cost_,(int *)&local_18);
    if (node2.f_cost_._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_18);
      if (gtest_ar_1._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_1._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                 ,0x36,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      if (local_18.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_18.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_18.data_ + 8))();
        }
        local_18.data_ = (AssertHelperData *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      ;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      ;
      local_18.data_ = (AssertHelperData *)nodes::compute_g((nodes *)&node1.f_cost_,0);
      gtest_ar_1.message_.ptr_._0_4_ = 1;
      testing::internal::CmpHelperEQ<double,int>
                ((internal *)&node2.f_cost_,"node2.compute_g(i)","1",(double *)&local_18,
                 (int *)&gtest_ar_1.message_);
      if (node2.f_cost_._0_1_ == '\0') {
        testing::Message::Message((Message *)&local_18);
        if (gtest_ar_1._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar_1._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                   ,0x39,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_18);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        if (local_18.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_18.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_18.data_ + 8))();
          }
          local_18.data_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        dVar3 = nodes::compute_h((nodes *)&node1.f_cost_,1,1);
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)&node2.f_cost_,"node2.compute_h(1, 1)","0.0",dVar3,0.0);
        if (node2.f_cost_._0_1_ == '\0') {
          testing::Message::Message((Message *)&local_18);
          if (gtest_ar_1._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar_1._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                     ,0x3b,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_18);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
          if (local_18.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_18.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_18.data_ + 8))();
            }
            local_18.data_ = (AssertHelperData *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          dVar3 = nodes::compute_f((nodes *)&node1.f_cost_,1,1);
          testing::internal::CmpHelperFloatingPointEQ<double>
                    ((internal *)&node2.f_cost_,"node2.compute_f(1, 1)","1.0",dVar3,1.0);
          if (node2.f_cost_._0_1_ == '\0') {
            testing::Message::Message((Message *)&local_18);
            if (gtest_ar_1._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar_1._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                       ,0x3d,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_18);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
            if (local_18.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_18.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_18.data_ + 8))();
              }
              local_18.data_ = (AssertHelperData *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
      }
    }
    nodes::~nodes((nodes *)&node1.f_cost_);
  }
  nodes::~nodes((nodes *)local_60);
  return;
}

Assistant:

TEST(nodesTest, methodTesting) {
  nodes node1;

  ASSERT_EQ(node1.x_, 0);

  nodes node2(1, 1, 0, 0);
  ASSERT_EQ(node2.f_cost_, 0);

  int i = 0;
  ASSERT_EQ(node2.compute_g(i), 1);

  ASSERT_DOUBLE_EQ(node2.compute_h(1, 1), 0.0);

  ASSERT_DOUBLE_EQ(node2.compute_f(1, 1), 1.0);
}